

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcDec.c
# Opt level: O1

int Bdc_DecomposeFindInitialVarSet(Bdc_Man_t *p,Bdc_Isf_t *pIsf,Bdc_Isf_t *pIsfL,Bdc_Isf_t *pIsfR)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  uint uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  char pVars [16];
  undefined8 local_50;
  byte abStack_48 [24];
  ulong uVar9;
  
  if (pIsfL->uSupp != 0) {
    __assert_fail("pIsfL->uSupp == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/bdc/bdcDec.c"
                  ,0xd5,
                  "int Bdc_DecomposeFindInitialVarSet(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)"
                 );
  }
  if (pIsfR->uSupp != 0) {
    __assert_fail("pIsfR->uSupp == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/bdc/bdcDec.c"
                  ,0xd6,
                  "int Bdc_DecomposeFindInitialVarSet(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)"
                 );
  }
  uVar3 = p->nVars;
  uVar12 = 0;
  if (0 < (int)uVar3) {
    uVar4 = pIsf->uSupp;
    uVar12 = 0;
    uVar10 = 0;
    do {
      if ((uVar4 >> (uVar10 & 0x1f) & 1) != 0) {
        lVar11 = (long)(int)uVar12;
        uVar12 = uVar12 + 1;
        abStack_48[lVar11] = (byte)uVar10;
      }
      uVar10 = uVar10 + 1;
    } while (uVar3 != uVar10);
  }
  if (0 < (int)uVar12) {
    uVar7 = 0;
    local_50 = pIsfR;
    do {
      bVar1 = abStack_48[uVar7];
      Kit_TruthExistNew(p->puTemp1,pIsf->puOff,p->nVars,(int)(char)bVar1);
      uVar13 = (ulong)uVar12;
      while ((long)uVar7 < (long)(uVar13 - 1)) {
        bVar2 = abStack_48[uVar13 - 1];
        Kit_TruthExistNew(p->puTemp2,pIsf->puOff,p->nVars,(int)(char)bVar2);
        uVar9 = (ulong)(uint)(1 << ((char)p->nVars - 5U & 0x1f));
        if (p->nVars < 6) {
          uVar9 = 1;
        }
        do {
          iVar8 = (int)uVar9;
          if (iVar8 < 1) goto LAB_005c1bb5;
          lVar11 = uVar9 - 1;
          lVar5 = uVar9 - 1;
          lVar6 = uVar9 - 1;
          uVar9 = uVar9 - 1;
        } while ((p->puTemp2[lVar6] & p->puTemp1[lVar11] & pIsf->puOn[lVar5]) == 0);
        uVar13 = uVar13 - 1;
        if (iVar8 < 1) {
LAB_005c1bb5:
          pIsfL->uUniq = 1 << (bVar1 & 0x1f);
          local_50->uUniq = 1 << (bVar2 & 0x1f);
          return 1;
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar12);
  }
  return 0;
}

Assistant:

int Bdc_DecomposeFindInitialVarSet( Bdc_Man_t * p, Bdc_Isf_t * pIsf, Bdc_Isf_t * pIsfL, Bdc_Isf_t * pIsfR )
{
    char pVars[16];
    int v, nVars, Beg, End;

    assert( pIsfL->uSupp == 0 );
    assert( pIsfR->uSupp == 0 );

    // fill in the variables
    nVars = 0;
    for ( v = 0; v < p->nVars; v++ )
        if ( pIsf->uSupp & (1 << v) )
            pVars[nVars++] = v;

    // try variable pairs
    for ( Beg = 0; Beg < nVars; Beg++ )
    {
        Kit_TruthExistNew( p->puTemp1, pIsf->puOff, p->nVars, pVars[Beg] ); 
        for ( End = nVars - 1; End > Beg; End-- )
        {
            Kit_TruthExistNew( p->puTemp2, pIsf->puOff, p->nVars, pVars[End] ); 
            if ( Kit_TruthIsDisjoint3(pIsf->puOn, p->puTemp1, p->puTemp2, p->nVars) )
            {
                pIsfL->uUniq = (1 << pVars[Beg]);
                pIsfR->uUniq = (1 << pVars[End]);
                return 1;
            }
        }
    }
    return 0;
}